

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  Mat *this_00;
  uint _c;
  bool bVar2;
  bool bVar3;
  int _w;
  int _h;
  pointer pMVar4;
  int iVar5;
  size_t sVar6;
  int *in_R8;
  Mat *pMVar7;
  ulong uVar8;
  int _woffset;
  int local_128;
  int _outw;
  int _hoffset;
  int _outh;
  Option *local_118;
  undefined8 local_110;
  pointer local_108;
  int _outc;
  int _coffset;
  size_t local_f8;
  Mat m;
  Mat bottom_blob_sliced;
  Mat borderm;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_128 = this_00->w;
  iVar5 = this_00->h;
  local_110._0_4_ = this_00->c;
  iVar1 = this_00->dims;
  sVar6 = this_00->elemsize;
  local_108 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_118 = opt;
  if (this->woffset == -0xe9) {
    Mat::shape(&bottom_blob_sliced,this_00);
    in_R8 = &_hoffset;
    resolve_crop_roi((Crop *)&_outh,&bottom_blob_sliced,(int *)this_00[1].data,&_woffset,in_R8,
                     &_coffset,&_outw,&_outh,&_outc);
  }
  else {
    local_f8 = sVar6;
    Mat::shape(&bottom_blob_sliced,this_00);
    Mat::shape(&m,this_00 + 1);
    sVar6 = local_f8;
    if (bottom_blob_sliced.dims == 3) {
      _woffset = this->woffset;
      pMVar7 = &bottom_blob_sliced;
      if (m.dims == 3) {
        pMVar7 = &m;
      }
      _outc = pMVar7->c;
      _hoffset = this->hoffset;
      _coffset = this->coffset;
      _outw = m.w;
      _outh = m.h;
    }
    else if (bottom_blob_sliced.dims == 2) {
      _woffset = this->woffset;
      _hoffset = this->hoffset;
      _outw = m.w;
      _outh = m.h;
    }
    else if (bottom_blob_sliced.dims == 1) {
      _woffset = this->woffset;
      _outw = m.w;
    }
    Mat::~Mat(&m);
  }
  Mat::~Mat(&bottom_blob_sliced);
  _c = _outc;
  pMVar4 = local_108;
  _h = _outh;
  _w = _outw;
  if (iVar1 == 3) {
    bVar2 = iVar5 != _outh;
    bVar3 = local_128 != _outw;
    local_f8 = sVar6;
    if ((bVar2 || bVar3) || (_outc != (int)local_110)) {
      iVar5 = _outc;
      Mat::channel_range(&bottom_blob_sliced,this_00,_coffset,_outc);
      sVar6 = local_f8;
      pMVar4 = local_108;
      if (bVar2 || bVar3) {
        Mat::create(local_108,_w,_h,_c,local_f8,local_118->blob_allocator);
        local_110._0_1_ = true;
        local_110._1_3_ = 0xffffff;
        local_110._4_4_ = -1;
        if ((pMVar4->data != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
          local_128 = _hoffset;
          local_110._0_1_ = false;
          local_110._1_3_ = 0;
          local_110._4_4_ = 0;
          if ((int)_c < 1) {
            _c = 0;
          }
          local_118 = (Option *)CONCAT44(local_118._4_4_,_woffset);
          for (uVar8 = 0; _c != uVar8; uVar8 = uVar8 + 1) {
            m.data = (void *)(bottom_blob_sliced.cstep * uVar8 * bottom_blob_sliced.elemsize +
                             (long)bottom_blob_sliced.data);
            m.refcount = (int *)0x0;
            m.elemsize = bottom_blob_sliced.elemsize;
            m.elempack = bottom_blob_sliced.elempack;
            m.allocator = bottom_blob_sliced.allocator;
            m.dims = 2;
            m.w = bottom_blob_sliced.w;
            m.h = bottom_blob_sliced.h;
            m.c = 1;
            m.cstep = (size_t)(bottom_blob_sliced.h * bottom_blob_sliced.w);
            Mat::channel(&borderm,pMVar4,(int)uVar8);
            if (sVar6 == 4) {
              copy_cut_border_image<float>(&m,&borderm,local_128,(int)local_118);
            }
            else if (sVar6 == 2) {
              copy_cut_border_image<unsigned_short>(&m,&borderm,local_128,(int)local_118);
            }
            else if (sVar6 == 1) {
              copy_cut_border_image<signed_char>(&m,&borderm,local_128,(int)local_118);
            }
            Mat::~Mat(&borderm);
            Mat::~Mat(&m);
          }
        }
      }
      else {
        Mat::clone(&m,(__fn *)&bottom_blob_sliced,(void *)0x0,iVar5,in_R8);
        Mat::operator=(pMVar4,&m);
        Mat::~Mat(&m);
        if ((pMVar4->data == (void *)0x0) ||
           (local_110._0_1_ = false, local_110._1_3_ = 0, local_110._4_4_ = 0,
           (long)pMVar4->c * pMVar4->cstep == 0)) {
          local_110._0_1_ = true;
          local_110._1_3_ = 0xffffff;
          local_110._4_4_ = -1;
        }
      }
      Mat::~Mat(&bottom_blob_sliced);
      return (int)local_110;
    }
  }
  else if (iVar1 == 2) {
    if (iVar5 != _outh || local_128 != _outw) {
      Mat::create(local_108,_outw,_outh,sVar6,local_118->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (sVar6 == 4) {
        copy_cut_border_image<float>(this_00,pMVar4,_hoffset,_woffset);
        return 0;
      }
      if (sVar6 != 2) {
        if (sVar6 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(this_00,pMVar4,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(this_00,pMVar4,_hoffset,_woffset);
      return 0;
    }
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    if (_outw != local_128) {
      Mat::create(local_108,_outw,sVar6,local_118->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      if (sVar6 == 4) {
        copy_cut_border_image<float>(this_00,pMVar4,0,_woffset);
        return 0;
      }
      if (sVar6 == 2) {
        copy_cut_border_image<unsigned_short>(this_00,pMVar4,0,_woffset);
        return 0;
      }
      if (sVar6 == 1) {
        copy_cut_border_image<signed_char>(this_00,pMVar4,0,_woffset);
        return 0;
      }
      return 0;
    }
  }
  Mat::operator=(local_108,this_00);
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _coffset, _outw, _outh, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}